

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

Command * __thiscall
anon_unknown.dwarf_28494c::CAPIBuildSystemFrontendDelegate::chooseCommandFromMultipleProducers
          (CAPIBuildSystemFrontendDelegate *this,Node *outputNode,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  pointer pcVar1;
  pointer ppCVar2;
  char *pcVar3;
  size_t sVar4;
  CAPIBuildKey *this_00;
  Command *pCVar5;
  StringRef str_00;
  string str;
  llb_build_key_t *output;
  char *local_70;
  size_t local_68;
  char local_60;
  undefined7 uStack_5f;
  BuildKey local_50;
  
  if ((this->cAPIDelegate).choose_command_from_multiple_producers ==
      (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
       *)0x0) {
    pCVar5 = (Command *)0x0;
  }
  else {
    pcVar1 = (outputNode->name)._M_dataplus._M_p;
    if (pcVar1 == (pointer)0x0) {
      local_70 = &local_60;
      local_68 = 0;
      local_60 = '\0';
    }
    else {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar1,pcVar1 + (outputNode->name)._M_string_length);
    }
    sVar4 = local_68;
    pcVar3 = local_70;
    this_00 = (CAPIBuildKey *)operator_new(0x38);
    str_00.Length = sVar4;
    str_00.Data = pcVar3;
    llbuild::buildsystem::BuildKey::BuildKey(&local_50,'N',str_00);
    CAPIBuildKey::CAPIBuildKey(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.key.key._M_dataplus._M_p != &local_50.key.key.field_2) {
      operator_delete(local_50.key.key._M_dataplus._M_p,
                      local_50.key.key.field_2._M_allocated_capacity + 1);
    }
    ppCVar2 = (commands->
              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_50.key.key._M_dataplus._M_p = (pointer)this_00;
    pCVar5 = (Command *)
             (*(this->cAPIDelegate).choose_command_from_multiple_producers)
                       ((this->cAPIDelegate).context,(llb_build_key_t **)&local_50,
                        (llb_buildsystem_command_t **)ppCVar2,
                        (long)(commands->
                              super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2 >> 3);
    llb_build_key_destroy((llb_build_key_t *)local_50.key.key._M_dataplus._M_p);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
  }
  return pCVar5;
}

Assistant:

virtual Command* chooseCommandFromMultipleProducers(Node* outputNode,
                   std::vector<Command*> commands) override {
    if (cAPIDelegate.choose_command_from_multiple_producers) {
      auto str = outputNode->getName().str();
      auto output = (llb_build_key_t *)new CAPIBuildKey(BuildKey::makeNode(str));

      llb_buildsystem_command_t* command = cAPIDelegate.choose_command_from_multiple_producers(
        cAPIDelegate.context,
        &output,
        (llb_buildsystem_command_t**)commands.data(),
        commands.size()
      );

      llb_build_key_destroy(output);

      return (Command*)command;
    } else {
      return nullptr;
    }
  }